

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O3

void __thiscall
cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger,string *name)

{
  cmPipeConnection *this_00;
  cmConnectionBufferStrategy *bufferStrategy;
  
  this_00 = (cmPipeConnection *)operator_new(0x88);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[3]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[4]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_00682930;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmPipeConnection::cmPipeConnection(this_00,name,bufferStrategy);
  cmDebugServer::cmDebugServer(&this->super_cmDebugServer,debugger,(cmConnection *)this_00);
  (this->super_cmDebugServer).super_cmServerBase._vptr_cmServerBase =
       (_func_int **)&PTR__cmDebugServerJson_00681bf8;
  (this->super_cmDebugServer).super_cmDebuggerListener._vptr_cmDebuggerListener =
       (_func_int **)&PTR__cmDebugServerJson_00681c68;
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger,
                                     const std::string& name)
  : cmDebugServerJson(debugger,
                      new cmPipeConnection(name, new cmServerBufferStrategy()))
{
}